

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

size_t fmt::v5::internal::count_code_points(undefined8 param_1,long param_2)

{
  size_t sVar1;
  long lVar2;
  size_t size;
  char8_t *data;
  
  sVar1 = 0;
  if (param_2 != 0) {
    lVar2 = 0;
    do {
      sVar1 = sVar1 + 1;
      lVar2 = lVar2 + 1;
    } while (param_2 != lVar2);
  }
  return sVar1;
}

Assistant:

FMT_FUNC size_t internal::count_code_points(basic_string_view<char8_t> s) {
  const char8_t *data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80)
      ++num_code_points;
  }
  return num_code_points;
}